

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O0

int __thiscall CServerBrowserFilter::CServerFilter::GetSortHash(CServerFilter *this)

{
  uint uVar1;
  CConfig *pCVar2;
  CServerFilter *in_RDI;
  int i;
  uint local_c;
  
  pCVar2 = Config(in_RDI);
  uVar1 = pCVar2->m_BrSort;
  pCVar2 = Config(in_RDI);
  local_c = pCVar2->m_BrSortOrder << 3 | uVar1 & 7;
  if (((in_RDI->m_FilterInfo).m_SortHash & 0x10U) != 0) {
    local_c = local_c | 0x10;
  }
  if (((in_RDI->m_FilterInfo).m_SortHash & 0x20U) != 0) {
    local_c = local_c | 0x20;
  }
  if (((in_RDI->m_FilterInfo).m_SortHash & 0x40U) != 0) {
    local_c = local_c | 0x40;
  }
  if (((in_RDI->m_FilterInfo).m_SortHash & 0x80U) != 0) {
    local_c = local_c | 0x80;
  }
  if (((in_RDI->m_FilterInfo).m_SortHash & 0x100U) != 0) {
    local_c = local_c | 0x100;
  }
  if (((in_RDI->m_FilterInfo).m_SortHash & 0x200U) != 0) {
    local_c = local_c | 0x200;
  }
  if (((in_RDI->m_FilterInfo).m_SortHash & 0x400U) != 0) {
    local_c = local_c | 0x400;
  }
  if (((in_RDI->m_FilterInfo).m_SortHash & 0x800U) != 0) {
    local_c = local_c | 0x800;
  }
  if (((in_RDI->m_FilterInfo).m_SortHash & 0x1000U) != 0) {
    local_c = local_c | 0x1000;
  }
  if (((in_RDI->m_FilterInfo).m_SortHash & 0x2000U) != 0) {
    local_c = local_c | 0x2000;
  }
  if (((in_RDI->m_FilterInfo).m_SortHash & 0x4000U) != 0) {
    local_c = local_c | 0x4000;
  }
  return local_c;
}

Assistant:

int CServerBrowserFilter::CServerFilter::GetSortHash() const
{
	int i = Config()->m_BrSort&0x7;
	i |= Config()->m_BrSortOrder<<3;
	if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_BOTS) i |= 1<<4;
	if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_EMPTY) i |= 1<<5;
	if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FULL) i |= 1<<6;
	if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_SPECTATORS) i |= 1<<7;
	if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FRIENDS) i |= 1<<8;
	if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_PW) i |= 1<<9;
	if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FAVORITE) i |= 1<<10;
	if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_COMPAT_VERSION) i |= 1<<11;
	if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_PURE) i |= 1<<12;
	if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_PURE_MAP) i |= 1<<13;
	if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_COUNTRY) i |= 1<<14;
	return i;
}